

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventmultiplexer.cxx
# Opt level: O0

bool __thiscall EventMultiplexer::addSource(EventMultiplexer *this,StochasticEventGenerator *source)

{
  size_type sVar1;
  size_type sVar2;
  StochasticEventGenerator *pSStack_18;
  uint sizeBefore;
  StochasticEventGenerator *source_local;
  EventMultiplexer *this_local;
  
  pSStack_18 = source;
  source_local = &this->super_StochasticEventGenerator;
  sVar1 = std::vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>::size
                    (&this->multiSources);
  std::vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>::push_back
            (&this->multiSources,&stack0xffffffffffffffe8);
  sVar2 = std::vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>::size
                    (&this->multiSources);
  return sVar2 == (int)sVar1 + 1;
}

Assistant:

bool EventMultiplexer::addSource( StochasticEventGenerator *source )
{
	uint sizeBefore = multiSources.size();
	multiSources.push_back(source);

	return multiSources.size() == sizeBefore+1;
}